

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_machine.cpp
# Opt level: O0

uint64_t randomx::getSmallPositiveFloatBits(uint64_t entropy)

{
  uint64_t mantissa;
  uint64_t exponent;
  uint64_t entropy_local;
  
  return (entropy >> 0x3b) + 0x3ff << 0x34 | entropy & 0xfffffffffffff;
}

Assistant:

static inline uint64_t getSmallPositiveFloatBits(uint64_t entropy) {
		auto exponent = entropy >> 59; //0..31
		auto mantissa = entropy & mantissaMask;
		exponent += exponentBias;
		exponent &= exponentMask;
		exponent <<= mantissaSize;
		return exponent | mantissa;
	}